

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void init_nhcolors(void)

{
  ulong uVar1;
  
  uVar1 = has_colors();
  if ((uVar1 & 1) != 0) {
    ui_flags.color = '\x01';
    start_color();
    use_default_colors();
    read_colormap(&color_map);
    apply_colormap(&color_map);
  }
  return;
}

Assistant:

void init_nhcolors(void)
{
    if (!has_colors())
	return;

    ui_flags.color = TRUE;

    start_color();
    use_default_colors();

    read_colormap(&color_map);
    apply_colormap(&color_map);
}